

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,int index)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  layer_creator_func layer_creator;
  int custom_layer_registry_entry_count;
  Layer *local_8;
  
  sVar1 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::size
                    ((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                      *)(in_RDI + 0x58));
  if ((in_ESI < 0) || ((int)sVar1 <= in_ESI)) {
    local_8 = (Layer *)0x0;
  }
  else {
    pvVar2 = std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::
             operator[]((vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                         *)(in_RDI + 0x58),(long)in_ESI);
    if (pvVar2->creator == (layer_creator_func)0x0) {
      local_8 = (Layer *)0x0;
    }
    else {
      local_8 = (*pvVar2->creator)();
    }
  }
  return local_8;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const int custom_layer_registry_entry_count = custom_layer_registry.size();
    if (index < 0 || index >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    return layer_creator();
}